

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_module.cc
# Opt level: O2

PackedFunc *
tvm::runtime::WrapPackedFunc
          (PackedFunc *__return_storage_ptr__,TVMBackendPackedCFunc faddr,
          ObjectPtr<tvm::runtime::Object> *sptr_to_self)

{
  Object *pOVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  TVMBackendPackedCFunc local_30;
  ObjectPtr<tvm::runtime::Object> local_28;
  
  pOVar1 = sptr_to_self->data_;
  if (pOVar1 != (Object *)0x0) {
    LOCK();
    (pOVar1->ref_counter_).super___atomic_base<int>._M_i =
         (pOVar1->ref_counter_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_30 = faddr;
  local_28.data_ = pOVar1;
  local_58._M_unused._M_object = operator_new(0x10);
  *(TVMBackendPackedCFunc *)local_58._M_unused._0_8_ = faddr;
  *(Object **)((long)local_58._M_unused._0_8_ + 8) = pOVar1;
  if (pOVar1 != (Object *)0x0) {
    LOCK();
    (pOVar1->ref_counter_).super___atomic_base<int>._M_i =
         (pOVar1->ref_counter_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pcStack_40 = std::
               _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/library_module.cc:80:21)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/library_module.cc:80:21)>
             ::_M_manager;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::function
            (&__return_storage_ptr__->body_,
             (function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ObjectPtr<tvm::runtime::Object>::~ObjectPtr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

PackedFunc WrapPackedFunc(TVMBackendPackedCFunc faddr,
                          const ObjectPtr<Object>& sptr_to_self) {
  return PackedFunc([faddr, sptr_to_self](TVMArgs args, TVMRetValue* rv) {
      TVMValue ret_value;
      int ret_type_code = kTVMNullptr;
      int ret = (*faddr)(
          const_cast<TVMValue*>(args.values),
          const_cast<int*>(args.type_codes),
          args.num_args,
          &ret_value,
          &ret_type_code);
      CHECK_EQ(ret, 0) << TVMGetLastError();
      if (ret_type_code != kTVMNullptr) {
        *rv = TVMRetValue::MoveFromCHost(ret_value, ret_type_code);
      }
    });
}